

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O2

void done_generating_code(void)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  uint16 *puVar6;
  long lVar7;
  long lVar8;
  
  if (preprocess_only == FALSE) {
    fputs("\n#ifdef USE_DIRECT_DISPATCH\n    static const void* dispatch_table[] = {\n",
          (FILE *)syn68k_c_stream);
    for (lVar7 = 0; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
      if (synthetic_opcode_taken[lVar7] == 0xff) {
        fprintf((FILE *)syn68k_c_stream,"        &&S68K_HANDLE_0x%04lX,\n",lVar7);
      }
    }
    fputs("        0\n    };\nreturn_dispatch_table:\n    *out_dispatch_table = dispatch_table;\n}\n"
          ,(FILE *)syn68k_c_stream);
    fputs("#else\n       }\n    }\n}\n#endif /* USE_DIRECT_DISPATCH */\n",(FILE *)syn68k_c_stream);
    if (verbose != FALSE) {
      printf("Outputting opcode map index table...");
      fflush(_stdout);
    }
    fputs("#include \"syn68k_private.h\"\n\nconst uint16 opcode_map_index[65536] = {\n",
          (FILE *)mapindex_c_stream);
    puVar6 = map_index;
    for (uVar5 = 0; uVar5 != 0x10000; uVar5 = uVar5 + 1) {
      uVar1 = *puVar6;
      if (*puVar6 == 0) {
        uVar1 = map_index[0x4afc];
      }
      pcVar4 = "";
      if ((uVar5 & 7) == 0) {
        pcVar4 = "  ";
      }
      fprintf((FILE *)mapindex_c_stream,"%s0x%04X,",pcVar4,(ulong)uVar1);
      if (((uint)uVar5 & 7) == 7) {
        fprintf((FILE *)mapindex_c_stream,"  /* 0x%04X */\n",(ulong)((uint)uVar5 - 7));
      }
      else {
        putc(0x20,(FILE *)mapindex_c_stream);
      }
      puVar6 = puVar6 + 1;
    }
    fputs("};\n",(FILE *)mapindex_c_stream);
    if (verbose != FALSE) {
      puts("done.");
      if (verbose != FALSE) {
        printf("Outputting opcode map information table...");
        fflush(_stdout);
      }
    }
    iVar3 = parity;
    lVar7 = (long)num_map_infos;
    map_info_opcode_name[lVar7] = "Internal use: array terminator";
    num_map_infos = num_map_infos + 1;
    *(uint *)(opcode_map_info + lVar7) =
         *(uint *)(opcode_map_info + lVar7) & 0xfffffffe | iVar3 & 1U;
    fprintf((FILE *)mapinfo_c_stream,
            "#include \"syn68k_private.h\"\n#ifdef GENERATE_NATIVE_CODE\n#include \"native.h\"\n#include \"native/i386/host-xlate.h\"\n#include \"native/i386/xlate-aux.h\"\n#endif\n\nconst OpcodeMappingInfo opcode_map_info[%d] = {\n"
           );
    lVar7 = 0x14a548;
    for (lVar8 = 0; lVar8 < num_map_infos; lVar8 = lVar8 + 1) {
      if (lVar8 != 0) {
        iVar3 = strcmp(map_info_opcode_name[lVar8],
                       *(char **)(opcode_map_info[0xffff].bitfield + lVar8 * 4));
        if (iVar3 != 0) {
          putc(10,(FILE *)mapinfo_c_stream);
        }
      }
      uVar2 = *(uint *)(opcode_map_info + lVar8);
      fprintf((FILE *)mapinfo_c_stream,
              "  /* 0x%04X: %s */\n  { %d, 0x%02X, 0x%02X, 0x%02X, %d, %d, %d, %d, %d, %d, %d, %2d, 0x%04X, 0x%04X,\n"
              ,lVar8,map_info_opcode_name[lVar8],(ulong)(uVar2 & 1),(ulong)(uVar2 >> 1 & 0x1f),
              (ulong)(uVar2 >> 6 & 0x1f),(ulong)(uVar2 >> 0xb & 0x1f),(ulong)(uVar2 >> 0x10 & 0xf),
              (ulong)(uVar2 >> 0x14 & 1),(ulong)(uVar2 >> 0x15 & 1),(ulong)(uVar2 >> 0x16 & 3),
              (ulong)(uVar2 >> 0x18 & 3),(ulong)(uVar2 >> 0x1a & 1),(ulong)(uVar2 >> 0x1b & 1),
              (ulong)(uVar2 >> 0x1c),(ulong)opcode_map_info[lVar8].opcode_and_bits,
              (ulong)opcode_map_info[lVar8].opcode_add_bits);
      fputs("   { ",(FILE *)mapinfo_c_stream);
      for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
        if ((uVar5 & 1) == 0 && uVar5 != 0) {
          fputs("\n     ",(FILE *)mapinfo_c_stream);
        }
        uVar1 = *(ushort *)(lVar7 + uVar5 * 2);
        pcVar4 = ", ";
        if (uVar5 == 3) {
          pcVar4 = "";
        }
        fprintf((FILE *)mapinfo_c_stream,"{ %d, %d, %d, %d, %d, %d }%s",(ulong)(uVar1 & 1),
                (ulong)(uVar1 >> 1 & 0x7f),(ulong)(uVar1 >> 8 & 0x1f),(ulong)(uVar1 >> 0xd & 1),
                (ulong)(uVar1 >> 0xe & 1),(ulong)(uVar1 >> 0xf),pcVar4);
      }
      fputs(" } },\n",(FILE *)mapinfo_c_stream);
      lVar7 = lVar7 + 0x10;
    }
    fputs("};\n",(FILE *)mapinfo_c_stream);
    if (verbose != FALSE) {
      puts("done.");
      return;
    }
  }
  return;
}

Assistant:

void
done_generating_code ()
{
  if (!preprocess_only)
    {
      long i;


			/* Output the end of the interpreter function. */
			
			/* direct-dispatch case:
					 output the dispatch table
					 and code for returning it from the function.
					 */
			fputs("\n"
			      "#ifdef USE_DIRECT_DISPATCH\n"
						"    static const void* dispatch_table[] = {\n",
					  syn68k_c_stream);
		  for (i = 0; i < 65536; i++)
      {
        if (synthetic_opcode_taken[i] == OPCODE_TAKEN)
          {
            fprintf (syn68k_c_stream,
                     "        &&S68K_HANDLE_0x%04lX,\n",
                     (unsigned long) i);
          }
			}
			fputs("        0\n"
						"    };\n"
						"return_dispatch_table:\n"
						"    *out_dispatch_table = dispatch_table;\n"
            "}\n",
            syn68k_c_stream);

      /* Non-direct dispatch version: */
      fputs (
	     "#else\n"
	     "       }\n"
	     "    }\n"
	     "}\n"
			 "#endif /* USE_DIRECT_DISPATCH */\n",
	     syn68k_c_stream);

      /* Output opcode map. */
      if (verbose)
	printf ("Outputting opcode map index table..."), fflush (stdout);

      /* Output preamble for mapindex_c_stream. */
      fputs ("#include \"syn68k_private.h\"\n"
	     "\n"
	     "const uint16 opcode_map_index[65536] = {\n"
	     , mapindex_c_stream);

      /* Print out all of the values w/big endian indices. */
      for (i = 0; i < 65536; i++)
	{
	  unsigned ix = map_index[i];
	  if (ix == 0)      /* Iff no map computed, make it behave */
	    ix = map_index[0x4AFC];  /* like ILLEGAL. */
	  fprintf (mapindex_c_stream, "%s0x%04X,", ((i % 8) == 0) ? "  " : "",
		   ix);
	  if ((i % 8) == 7)
	    fprintf (mapindex_c_stream, "  /* 0x%04X */\n", (unsigned) i - 7);
	  else putc (' ', mapindex_c_stream);
	}

      /* Output postamble for map index. */
      fputs ("};\n", mapindex_c_stream);

      if (verbose)
	puts ("done.");

      /* Output map info. */
      if (verbose)
	printf ("Outputting opcode map information table..."), fflush (stdout);

      /* Add a dummy entry at the end with a different parity so the last
       * map info sequence will be terminated.
       */
      opcode_map_info[num_map_infos].sequence_parity = parity;
      map_info_opcode_name[num_map_infos] = "Internal use: array terminator";
      num_map_infos++;

      /* Output preamble for mapinfo_c_stream. */
      fprintf (mapinfo_c_stream,
	       "#include \"syn68k_private.h\"\n"
	       "#ifdef GENERATE_NATIVE_CODE\n"
	       "#include \"native.h\"\n"
	       "#include \"native/i386/host-xlate.h\"\n"
	       "#include \"native/i386/xlate-aux.h\"\n"
	       "#endif\n"
	       "\n"
	       "const OpcodeMappingInfo opcode_map_info[%d] = {\n",
	       num_map_infos);

      /* Print out all of the structs. */
      for (i = 0; i < num_map_infos; i++)
	{
	  const OpcodeMappingInfo *m = &opcode_map_info[i];
	  int j;

	  /* Put blank line between distinct opcode sequences. */
	  if (i > 0 && strcmp (map_info_opcode_name[i],
			       map_info_opcode_name[i - 1]))
	    putc ('\n', mapinfo_c_stream);

	  /* Output the struct. */
	  fprintf (mapinfo_c_stream,
		   "  /* 0x%04X: %s */\n"
		   "  { %d, 0x%02X, 0x%02X, 0x%02X, %d, %d, %d, %d, %d, "
		   "%d, %d, %2d, 0x%04X, 0x%04X,\n",
		   (unsigned) i, map_info_opcode_name[i],
		   m->sequence_parity,
		   (unsigned) m->cc_may_set,
		   (unsigned) m->cc_may_not_set,
		   (unsigned) m->cc_needed,
		   m->instruction_words, m->ends_block,
		   m->next_block_dynamic,
		   m->amode_size, m->reversed_amode_size, m->amode_expanded,
		   m->reversed_amode_expanded,
		   m->opcode_shift_count, (unsigned) m->opcode_and_bits,
		   (unsigned) m->opcode_add_bits);

	  /* Output the bitfields. */
	  fputs ("   { ", mapinfo_c_stream);
	  for (j = 0; j < MAX_BITFIELDS; j++)
	    {
	      if (j != 0 && (j % 2) == 0)
		fputs ("\n     ", mapinfo_c_stream);
	      fprintf (mapinfo_c_stream, "{ %d, %d, %d, %d, %d, %d }%s",
		       m->bitfield[j].rev_amode, m->bitfield[j].index,
		       m->bitfield[j].length, m->bitfield[j].sign_extend,
		       m->bitfield[j].make_native_endian,
		       m->bitfield[j].words,
		       (j == sizeof m->bitfield / sizeof m->bitfield[0] - 1)
		       ? "" : ", ");
	    }
#ifdef GENERATE_NATIVE_CODE
	  fprintf (mapinfo_c_stream,
		   " },\n"
		   "     %s%s },\n",
		   (m->guest_code_descriptor == NULL) ? "" : "&",
		   ((m->guest_code_descriptor == NULL)
		    ? "NULL" : m->guest_code_descriptor));
#else
	  fputs (" } },\n", mapinfo_c_stream);
#endif
	}
	  
      /* Output postamble for map info. */
      fputs ("};\n", mapinfo_c_stream);
      
      if (verbose)
	puts ("done.");
    }
}